

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O0

void __thiscall
iutest::detail::
TypeParameterizedTestSuite<TypeParamTest,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::StaticMul2,_iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>,_iutest::detail::TypeList1<float>_>
::
EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>_>
::EachTest(EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>_>
           *this,TestSuite *testsuite,string *name)

{
  UnitTest *this_00;
  string *name_local;
  TestSuite *testsuite_local;
  EachTest<float,_iutest::detail::VariadicTemplateTypeList<iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>_>
  *this_local;
  
  iuIObject::iuIObject(&this->super_iuIObject);
  (this->super_iuIObject)._vptr_iuIObject = (_func_int **)&PTR__EachTest_00620ac8;
  TestSuiteMediator::TestSuiteMediator(&this->m_mediator,testsuite);
  iuFactory<iutest_typed_test_suite_p_name_TypeParamTest_::Mul2<float>_>::iuFactory
            (&this->m_factory);
  TestInfo::TestInfo(&this->m_info,&(this->m_mediator).super_iuITestSuiteMediator,name,
                     &(this->m_factory).super_iuFactoryBase);
  this_00 = UnitTest::instance();
  UnitTestImpl::AddTestInfo(&this_00->super_UnitTestImpl,testsuite,&this->m_info);
  return;
}

Assistant:

EachTest(TestSuite* testsuite, const ::std::string& name)
            : m_mediator(testsuite)
            , m_info(&m_mediator, name, &m_factory)
        {
            UnitTest::instance().AddTestInfo(testsuite, &m_info);
        }